

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa_io.c
# Opt level: O2

int IDASetMaxStepB(void *ida_mem,int which,sunrealtype hmaxB)

{
  int iVar1;
  int *piVar2;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    ida_mem = (IDAMem)0x0;
    iVar1 = 0x14d;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    error_code = -0x65;
    iVar1 = 0x156;
  }
  else {
    if (which < *(int *)(*(long *)((long)ida_mem + 0x840) + 0x38)) {
      for (piVar2 = (int *)(*(long *)((long)ida_mem + 0x840) + 0x30);
          (piVar2 = *(int **)piVar2, piVar2 != (int *)0x0 && (*piVar2 != which));
          piVar2 = piVar2 + 0x20) {
      }
      iVar1 = IDASetMaxStep(*(void **)(piVar2 + 4),hmaxB);
      return iVar1;
    }
    msgfmt = "Illegal value for which.";
    error_code = -0x16;
    iVar1 = 0x15f;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar1,"IDASetMaxStepB",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetMaxStepB(void* ida_mem, int which, sunrealtype hmaxB)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  void* ida_memB;

  /* Is ida_mem valid? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return IDA_MEM_NULL;
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_WHICH);
    return (IDA_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }
  ida_memB = (void*)IDAB_mem->IDA_mem;

  return IDASetMaxStep(ida_memB, hmaxB);
}